

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotBarsHEx<ImPlot::GetterXsYs<signed_char>,double>
               (char *label_id,GetterXsYs<signed_char> *getter,double height)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  ImPlotPlot *pIVar10;
  double dVar11;
  ImPlotContext *pIVar12;
  bool bVar13;
  ImU32 col;
  ImU32 col_00;
  ImDrawList *this;
  int iVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  ImPlotRange *pIVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  ImVec2 b;
  ImVec2 a;
  byte local_44;
  ImVec2 local_40;
  ImVec2 local_38;
  
  bVar13 = BeginItem(label_id,1);
  pIVar12 = GImPlot;
  if (bVar13) {
    dVar24 = height * 0.5;
    if ((GImPlot->FitThisFrame == true) && (iVar14 = getter->Count, 0 < iVar14)) {
      pcVar8 = getter->Xs;
      pcVar9 = getter->Ys;
      iVar17 = getter->Offset;
      iVar4 = getter->Stride;
      pIVar10 = GImPlot->CurrentPlot;
      iVar5 = pIVar10->CurrentYAxis;
      uVar6 = (pIVar10->XAxis).Flags;
      pIVar18 = GImPlot->ExtentsY + iVar5;
      uVar7 = pIVar10->YAxis[iVar5].Flags;
      iVar16 = 0;
      do {
        lVar15 = (long)(((iVar17 + iVar16) % iVar14 + iVar14) % iVar14) * (long)iVar4;
        cVar1 = pcVar8[lVar15];
        cVar2 = pcVar9[lVar15];
        dVar11 = (double)(int)cVar2 - dVar24;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((uVar6 & 0x20) == 0) {
LAB_001fb6c8:
            dVar22 = (pIVar12->ExtentsX).Min;
            dVar21 = 0.0;
            if (dVar22 <= 0.0) {
              dVar21 = dVar22;
            }
            (pIVar12->ExtentsX).Min = dVar21;
            dVar22 = (pIVar12->ExtentsX).Max;
            dVar21 = 0.0;
            if (0.0 <= dVar22) {
              dVar21 = dVar22;
            }
            (pIVar12->ExtentsX).Max = dVar21;
          }
        }
        else if ((((uVar6 & 0x20) == 0) && (pIVar10->YAxis[iVar5].Range.Min <= dVar11)) &&
                (dVar11 <= pIVar10->YAxis[iVar5].Range.Max)) goto LAB_001fb6c8;
        if ((uVar7 >> 10 & 1) == 0) {
          if ((long)ABS(dVar11) < 0x7ff0000000000000) {
LAB_001fb726:
            if ((0.0 < dVar11) || ((uVar7 & 0x20) == 0)) {
              dVar22 = dVar11;
              if (pIVar18->Min <= dVar11) {
                dVar22 = pIVar18->Min;
              }
              pIVar18->Min = dVar22;
              dVar22 = pIVar12->ExtentsY[iVar5].Max;
              if (dVar11 <= dVar22) {
                dVar11 = dVar22;
              }
              pIVar12->ExtentsY[iVar5].Max = dVar11;
            }
          }
        }
        else if ((((long)ABS(dVar11) < 0x7ff0000000000000) && ((pIVar10->XAxis).Range.Min <= 0.0))
                && (0.0 <= (pIVar10->XAxis).Range.Max)) goto LAB_001fb726;
        dVar22 = (double)(int)cVar1;
        dVar11 = (double)(int)cVar2 + dVar24;
        if ((uVar6 >> 10 & 1) == 0) {
          if (('\0' < cVar1) || ((uVar6 & 0x20) == 0)) {
LAB_001fb78b:
            dVar21 = (pIVar12->ExtentsX).Min;
            dVar23 = dVar22;
            if (dVar21 <= dVar22) {
              dVar23 = dVar21;
            }
            (pIVar12->ExtentsX).Min = dVar23;
            dVar21 = (pIVar12->ExtentsX).Max;
            dVar23 = dVar22;
            if (dVar22 <= dVar21) {
              dVar23 = dVar21;
            }
            (pIVar12->ExtentsX).Max = dVar23;
          }
        }
        else if (((pIVar10->YAxis[iVar5].Range.Min <= dVar11) &&
                 (dVar11 <= pIVar10->YAxis[iVar5].Range.Max)) &&
                (local_44 = (byte)((uVar6 & 0x20) >> 5), (cVar1 < '\x01' & local_44) == 0))
        goto LAB_001fb78b;
        if ((uVar7 >> 10 & 1) == 0) {
          if ((long)ABS(dVar11) < 0x7ff0000000000000) {
LAB_001fb7e9:
            if ((0.0 < dVar11) || ((uVar7 & 0x20) == 0)) {
              uVar19 = SUB84(dVar11,0);
              uVar20 = (undefined4)((ulong)dVar11 >> 0x20);
              dVar22 = pIVar18->Min;
              if (dVar22 <= dVar11) {
                uVar19 = SUB84(dVar22,0);
                uVar20 = (undefined4)((ulong)dVar22 >> 0x20);
              }
              pIVar18->Min = (double)CONCAT44(uVar20,uVar19);
              dVar22 = pIVar12->ExtentsY[iVar5].Max;
              if (dVar11 <= dVar22) {
                dVar11 = dVar22;
              }
              pIVar12->ExtentsY[iVar5].Max = dVar11;
            }
          }
        }
        else if ((((long)ABS(dVar11) < 0x7ff0000000000000) && ((pIVar10->XAxis).Range.Min <= dVar22)
                 ) && (dVar22 <= (pIVar10->XAxis).Range.Max)) goto LAB_001fb7e9;
        iVar16 = iVar16 + 1;
      } while (iVar14 != iVar16);
    }
    this = GetPlotDrawList();
    col = ImGui::GetColorU32((pIVar12->NextItemData).Colors);
    col_00 = ImGui::GetColorU32((pIVar12->NextItemData).Colors + 1);
    iVar14 = getter->Count;
    if (0 < iVar14) {
      bVar13 = (pIVar12->NextItemData).RenderFill;
      bVar3 = (pIVar12->NextItemData).RenderLine;
      iVar17 = 0;
      do {
        lVar15 = (long)(((getter->Offset + iVar17) % iVar14 + iVar14) % iVar14) *
                 (long)getter->Stride;
        cVar1 = getter->Xs[lVar15];
        if (cVar1 != '\0') {
          cVar2 = getter->Ys[lVar15];
          local_38 = PlotToPixels(0.0,(double)(int)cVar2 - dVar24,-1);
          local_40 = PlotToPixels((double)(int)cVar1,(double)(int)cVar2 + dVar24,-1);
          if ((pIVar12->NextItemData).RenderFill == true) {
            ImDrawList::AddRectFilled(this,&local_38,&local_40,col_00,0.0,0);
          }
          if (((bVar13 ^ 1U | col != col_00) & bVar3) != 0) {
            ImDrawList::AddRect(this,&local_38,&local_40,col,0.0,0xf0,
                                (pIVar12->NextItemData).LineWeight);
          }
        }
        iVar17 = iVar17 + 1;
        iVar14 = getter->Count;
      } while (iVar17 < iVar14);
    }
    pIVar12 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar12->NextItemData);
    pIVar12->PreviousItem = pIVar12->CurrentItem;
    pIVar12->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotBarsHEx(const char* label_id, const Getter& getter, THeight height) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        const THeight half_height = height / 2;
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(ImPlotPoint(0, p.y - half_height));
                FitPoint(ImPlotPoint(p.x, p.y + half_height));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        ImU32 col_line  = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
        ImU32 col_fill  = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
        bool  rend_line = s.RenderLine;
        if (s.RenderFill && col_line == col_fill)
            rend_line = false;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPoint p = getter(i);
            if (p.x == 0)
                continue;
            ImVec2 a = PlotToPixels(0, p.y - half_height);
            ImVec2 b = PlotToPixels(p.x, p.y + half_height);
            if (s.RenderFill)
                DrawList.AddRectFilled(a, b, col_fill);
            if (rend_line)
                DrawList.AddRect(a, b, col_line, 0, ImDrawFlags_RoundCornersAll, s.LineWeight);
        }
        EndItem();
    }
}